

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

float Jf_CutCompareArea(Jf_Cut_t *pOld,Jf_Cut_t *pNew)

{
  float fVar1;
  float fVar2;
  int iVar3;
  
  fVar1 = pOld->Flow;
  fVar2 = pNew->Flow;
  if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
    return fVar1 - fVar2;
  }
  iVar3 = pOld->pCut[0] - pNew->pCut[0];
  if ((iVar3 == 0) && (iVar3 = pOld->Time - pNew->Time, iVar3 == 0)) {
    return 0.0;
  }
  return (float)iVar3;
}

Assistant:

float Jf_CutCompareArea( Jf_Cut_t * pOld, Jf_Cut_t * pNew )
{
//    float Epsilon = (float)0.001;
//    if ( pOld->Flow > pNew->Flow + Epsilon ) return 1;
//    if ( pOld->Flow < pNew->Flow - Epsilon ) return -1;
    if ( pOld->Flow    != pNew->Flow    ) return pOld->Flow    - pNew->Flow;
    if ( pOld->pCut[0] != pNew->pCut[0] ) return pOld->pCut[0] - pNew->pCut[0];
    if ( pOld->Time    != pNew->Time    ) return pOld->Time    - pNew->Time;
    return 0;
}